

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<char> * __thiscall
cimg_library::CImg<char>::set_vector_at<char>(CImg<char> *this,CImg<char> *vec,uint x,uint y,uint z)

{
  unsigned_long uVar1;
  uint local_48;
  type_conflict4 local_44;
  char *pcStack_40;
  uint k;
  char *ptrd;
  unsigned_long whd;
  char *ptrs;
  uint local_20;
  uint z_local;
  uint y_local;
  uint x_local;
  CImg<char> *vec_local;
  CImg<char> *this_local;
  
  if (((x < this->_width) && (y < this->_height)) && (z < this->_depth)) {
    whd = (unsigned_long)vec->_data;
    ptrd = (char *)((ulong)this->_width * (ulong)this->_height * (ulong)this->_depth);
    ptrs._4_4_ = z;
    local_20 = y;
    z_local = x;
    _y_local = vec;
    vec_local = this;
    pcStack_40 = data(this,x,y,z,0);
    uVar1 = size(_y_local);
    local_48 = (uint)uVar1;
    local_44 = cimg::min<unsigned_int,unsigned_int>(&local_48,&this->_spectrum);
    for (; local_44 != 0; local_44 = local_44 - 1) {
      *pcStack_40 = *(char *)whd;
      pcStack_40 = ptrd + (long)pcStack_40;
      whd = whd + 1;
    }
  }
  return this;
}

Assistant:

CImg<T>& set_vector_at(const CImg<t>& vec, const unsigned int x, const unsigned int y=0, const unsigned int z=0) {
      if (x<_width && y<_height && z<_depth) {
        const t *ptrs = vec._data;
        const unsigned long whd = (unsigned long)_width*_height*_depth;
        T *ptrd = data(x,y,z);
        for (unsigned int k = cimg::min((unsigned int)vec.size(),_spectrum); k; --k) {
          *ptrd = (T)*(ptrs++); ptrd+=whd;
        }
      }
      return *this;
    }